

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

int Wlc_NtkDcFlopNum(Wlc_Ntk_t *p)

{
  size_t sVar1;
  bool local_25;
  int local_24;
  int Count;
  int nFlops;
  int i;
  Wlc_Ntk_t *p_local;
  
  local_24 = 0;
  if (p->pInits == (char *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    sVar1 = strlen(p->pInits);
    for (Count = 0; Count < (int)sVar1; Count = Count + 1) {
      local_25 = true;
      if (p->pInits[Count] != 'x') {
        local_25 = p->pInits[Count] == 'X';
      }
      local_24 = (uint)local_25 + local_24;
    }
    p_local._4_4_ = local_24;
  }
  return p_local._4_4_;
}

Assistant:

int Wlc_NtkDcFlopNum( Wlc_Ntk_t * p )
{
    int i, nFlops, Count = 0;
    if ( p->pInits == NULL )
        return 0;
    nFlops = strlen(p->pInits);
    for ( i = 0; i < nFlops; i++ )
        Count += (p->pInits[i] == 'x' || p->pInits[i] == 'X');
    return Count;
}